

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O3

void __thiscall xLearn::MODEL_TEST_Save_and_Load_Test::TestBody(MODEL_TEST_Save_and_Load_Test *this)

{
  real_t *prVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  bool bVar18;
  ulong uVar19;
  char *pcVar20;
  ushort uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  AssertionResult gtest_ar;
  index_t v_len;
  index_t w_len;
  index_t param_num_v;
  index_t param_num_w;
  Model new_model;
  Model model_ffm;
  HyperParam hyper_param;
  Message local_3a0;
  AssertHelper local_398;
  internal local_390 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  uint local_380;
  uint local_37c;
  uint local_378;
  uint local_374;
  real_t *local_370;
  real_t *local_368;
  Model local_360;
  Model local_2d0;
  HyperParam local_240;
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  
  Init();
  local_2d0.score_func_._M_dataplus._M_p = (pointer)&local_2d0.score_func_.field_2;
  local_2d0.score_func_._M_string_length = 0;
  local_2d0.score_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.loss_func_._M_dataplus._M_p = (pointer)&local_2d0.loss_func_.field_2;
  local_2d0.loss_func_._M_string_length = 0;
  local_2d0.loss_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.param_w_ = (real_t *)0x0;
  local_2d0.param_v_ = (real_t *)0x0;
  local_2d0.param_b_ = (real_t *)0x0;
  local_2d0.param_best_w_ = (real_t *)0x0;
  local_2d0.param_best_v_ = (real_t *)0x0;
  local_2d0.param_best_b_ = (real_t *)0x0;
  auVar28 = SUB6416(ZEXT464(0x3f800000),0);
  Model::Initialize(&local_2d0,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                    local_240.num_field,local_240.num_K,local_240.auxiliary_size,1.0);
  local_37c = local_2d0.param_num_w_;
  if ((ulong)local_2d0.param_num_w_ != 0) {
    auVar22 = vbroadcastss_avx512f(ZEXT416(0x40200000));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpbroadcastq_avx512f();
    auVar28 = auVar25._0_16_;
    uVar19 = 0;
    do {
      auVar26 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar26,auVar23);
      auVar26 = vporq_avx512f(auVar26,auVar24);
      uVar15 = vpcmpuq_avx512f(auVar26,auVar25,2);
      uVar16 = vpcmpuq_avx512f(auVar27,auVar25,2);
      bVar17 = (byte)uVar16;
      uVar21 = CONCAT11(bVar17,(byte)uVar15);
      prVar1 = local_2d0.param_w_ + uVar19;
      bVar18 = (bool)((byte)uVar15 & 1);
      bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar9 = (bool)(bVar17 >> 1 & 1);
      bVar10 = (bool)(bVar17 >> 2 & 1);
      bVar11 = (bool)(bVar17 >> 3 & 1);
      bVar12 = (bool)(bVar17 >> 4 & 1);
      bVar13 = (bool)(bVar17 >> 5 & 1);
      bVar14 = (bool)(bVar17 >> 6 & 1);
      *prVar1 = (real_t)((uint)bVar18 * auVar22._0_4_ | (uint)!bVar18 * (int)*prVar1);
      prVar1[1] = (real_t)((uint)bVar2 * auVar22._4_4_ | (uint)!bVar2 * (int)prVar1[1]);
      prVar1[2] = (real_t)((uint)bVar3 * auVar22._8_4_ | (uint)!bVar3 * (int)prVar1[2]);
      prVar1[3] = (real_t)((uint)bVar4 * auVar22._12_4_ | (uint)!bVar4 * (int)prVar1[3]);
      prVar1[4] = (real_t)((uint)bVar5 * auVar22._16_4_ | (uint)!bVar5 * (int)prVar1[4]);
      prVar1[5] = (real_t)((uint)bVar6 * auVar22._20_4_ | (uint)!bVar6 * (int)prVar1[5]);
      prVar1[6] = (real_t)((uint)bVar7 * auVar22._24_4_ | (uint)!bVar7 * (int)prVar1[6]);
      prVar1[7] = (real_t)((uint)bVar8 * auVar22._28_4_ | (uint)!bVar8 * (int)prVar1[7]);
      prVar1[8] = (real_t)((uint)(bVar17 & 1) * auVar22._32_4_ |
                          (uint)!(bool)(bVar17 & 1) * (int)prVar1[8]);
      prVar1[9] = (real_t)((uint)bVar9 * auVar22._36_4_ | (uint)!bVar9 * (int)prVar1[9]);
      prVar1[10] = (real_t)((uint)bVar10 * auVar22._40_4_ | (uint)!bVar10 * (int)prVar1[10]);
      prVar1[0xb] = (real_t)((uint)bVar11 * auVar22._44_4_ | (uint)!bVar11 * (int)prVar1[0xb]);
      prVar1[0xc] = (real_t)((uint)bVar12 * auVar22._48_4_ | (uint)!bVar12 * (int)prVar1[0xc]);
      prVar1[0xd] = (real_t)((uint)bVar13 * auVar22._52_4_ | (uint)!bVar13 * (int)prVar1[0xd]);
      prVar1[0xe] = (real_t)((uint)bVar14 * auVar22._56_4_ | (uint)!bVar14 * (int)prVar1[0xe]);
      prVar1[0xf] = (real_t)((uint)(bVar17 >> 7) * auVar22._60_4_ |
                            (uint)!(bool)(bVar17 >> 7) * (int)prVar1[0xf]);
      uVar19 = uVar19 + 0x10;
    } while (((ulong)local_2d0.param_num_w_ + 0xf & 0x1fffffff0) != uVar19);
  }
  local_380 = local_2d0.param_num_v_;
  if ((ulong)local_2d0.param_num_v_ != 0) {
    auVar22 = vbroadcastss_avx512f(ZEXT416(0x40600000));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpbroadcastq_avx512f();
    auVar28 = auVar25._0_16_;
    uVar19 = 0;
    do {
      auVar26 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar26,auVar23);
      auVar26 = vporq_avx512f(auVar26,auVar24);
      uVar15 = vpcmpuq_avx512f(auVar26,auVar25,2);
      uVar16 = vpcmpuq_avx512f(auVar27,auVar25,2);
      bVar17 = (byte)uVar16;
      uVar21 = CONCAT11(bVar17,(byte)uVar15);
      prVar1 = local_2d0.param_v_ + uVar19;
      bVar18 = (bool)((byte)uVar15 & 1);
      bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar9 = (bool)(bVar17 >> 1 & 1);
      bVar10 = (bool)(bVar17 >> 2 & 1);
      bVar11 = (bool)(bVar17 >> 3 & 1);
      bVar12 = (bool)(bVar17 >> 4 & 1);
      bVar13 = (bool)(bVar17 >> 5 & 1);
      bVar14 = (bool)(bVar17 >> 6 & 1);
      *prVar1 = (real_t)((uint)bVar18 * auVar22._0_4_ | (uint)!bVar18 * (int)*prVar1);
      prVar1[1] = (real_t)((uint)bVar2 * auVar22._4_4_ | (uint)!bVar2 * (int)prVar1[1]);
      prVar1[2] = (real_t)((uint)bVar3 * auVar22._8_4_ | (uint)!bVar3 * (int)prVar1[2]);
      prVar1[3] = (real_t)((uint)bVar4 * auVar22._12_4_ | (uint)!bVar4 * (int)prVar1[3]);
      prVar1[4] = (real_t)((uint)bVar5 * auVar22._16_4_ | (uint)!bVar5 * (int)prVar1[4]);
      prVar1[5] = (real_t)((uint)bVar6 * auVar22._20_4_ | (uint)!bVar6 * (int)prVar1[5]);
      prVar1[6] = (real_t)((uint)bVar7 * auVar22._24_4_ | (uint)!bVar7 * (int)prVar1[6]);
      prVar1[7] = (real_t)((uint)bVar8 * auVar22._28_4_ | (uint)!bVar8 * (int)prVar1[7]);
      prVar1[8] = (real_t)((uint)(bVar17 & 1) * auVar22._32_4_ |
                          (uint)!(bool)(bVar17 & 1) * (int)prVar1[8]);
      prVar1[9] = (real_t)((uint)bVar9 * auVar22._36_4_ | (uint)!bVar9 * (int)prVar1[9]);
      prVar1[10] = (real_t)((uint)bVar10 * auVar22._40_4_ | (uint)!bVar10 * (int)prVar1[10]);
      prVar1[0xb] = (real_t)((uint)bVar11 * auVar22._44_4_ | (uint)!bVar11 * (int)prVar1[0xb]);
      prVar1[0xc] = (real_t)((uint)bVar12 * auVar22._48_4_ | (uint)!bVar12 * (int)prVar1[0xc]);
      prVar1[0xd] = (real_t)((uint)bVar13 * auVar22._52_4_ | (uint)!bVar13 * (int)prVar1[0xd]);
      prVar1[0xe] = (real_t)((uint)bVar14 * auVar22._56_4_ | (uint)!bVar14 * (int)prVar1[0xe]);
      prVar1[0xf] = (real_t)((uint)(bVar17 >> 7) * auVar22._60_4_ |
                            (uint)!(bool)(bVar17 >> 7) * (int)prVar1[0xf]);
      uVar19 = uVar19 + 0x10;
    } while (((ulong)local_2d0.param_num_v_ + 0xf & 0x1fffffff0) != uVar19);
  }
  Model::Serialize(&local_2d0,&local_240.model_file);
  Model::Model(&local_360,&local_240.model_file);
  local_37c = local_360.param_num_w_;
  local_374 = local_240.num_feature * 2;
  local_368 = local_360.param_w_;
  local_370 = local_360.param_v_;
  local_380 = local_360.param_num_v_;
  local_378 = local_374 * local_240.num_field * local_240.num_K;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_390,"w_len","param_num_w",&local_37c,&local_374);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb4,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar22._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar22._8_56_ = extraout_var;
        auVar28 = auVar22._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_390,"v_len","param_num_v",&local_380,&local_378);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb5,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar23._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar23._8_56_ = extraout_var_00;
        auVar28 = auVar23._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ss_.ptr_._0_4_ = local_378 + 2 + local_374;
  local_398.data_._0_4_ = local_360.param_num_w_ + 2 + local_360.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_390,"param_num_v+param_num_w+2","new_model.GetNumParameter()",(uint *)&local_3a0,
             (uint *)&local_398);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb6,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar24._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar24._8_56_ = extraout_var_01;
        auVar28 = auVar24._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_390,"hyper_param.score_func","new_model.GetScoreFunction()",&local_240.score_func
             ,&local_360.score_func_);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb7,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar25._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar25._8_56_ = extraout_var_02;
        auVar28 = auVar25._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_390,"hyper_param.loss_func","new_model.GetLossFunction()",&local_240.loss_func,
             &local_360.loss_func_);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb8,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar26._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar26._8_56_ = extraout_var_03;
        auVar28 = auVar26._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ss_.ptr_._0_4_ = local_360.num_K_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_390,"hyper_param.num_K","new_model.GetNumK()",&local_240.num_K,(uint *)&local_3a0
            );
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb9,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar27._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar27._8_56_ = extraout_var_04;
        auVar28 = auVar27._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ss_.ptr_._0_4_ = local_360.num_feat_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_390,"hyper_param.num_feature","new_model.GetNumFeature()",&local_240.num_feature,
             (uint *)&local_3a0);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xba,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar29._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar29._8_56_ = extraout_var_05;
        auVar28 = auVar29._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.ss_.ptr_._0_4_ = local_360.num_field_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_390,"hyper_param.num_field","new_model.GetNumField()",&local_240.num_field,
             (uint *)&local_3a0);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbb,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        auVar30._0_8_ =
             (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) +
                         8))();
        auVar30._8_56_ = extraout_var_06;
        auVar28 = auVar30._0_16_;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar28 = vcvtusi2ss_avx512f(auVar28,local_360.aux_size_);
  local_3a0.ss_.ptr_._0_4_ = auVar28._0_4_;
  testing::internal::CmpHelperEQ<unsigned_int,float>
            (local_390,"hyper_param.auxiliary_size","new_model.GetAuxiliarySize()",
             &local_240.auxiliary_size,(float *)&local_3a0);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbc,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_390,"b[0]","0",*local_360.param_b_,0.0);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbd,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (local_390,"b[1]","1.0",local_360.param_b_[1],1.0);
  if (local_390[0] == (internal)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_388.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbe,pcVar20);
    testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
      bVar18 = testing::internal::IsTrue(true);
      if ((bVar18) &&
         ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_37c != 0) {
    uVar19 = 0;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_390,"w[i]","2.5",local_368[uVar19],2.5);
      if (local_390[0] == (internal)0x0) {
        testing::Message::Message(&local_3a0);
        pcVar20 = "";
        if (local_388.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_398,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                   ,0xc0,pcVar20);
        testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
        testing::internal::AssertHelper::~AssertHelper(&local_398);
        if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
          bVar18 = testing::internal::IsTrue(true);
          if ((bVar18) &&
             ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)
             ) {
            (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) + 8
                        ))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_37c);
  }
  if (local_380 != 0) {
    uVar19 = 0;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_390,"v[i]","3.5",local_370[uVar19],3.5);
      if (local_390[0] == (internal)0x0) {
        testing::Message::Message(&local_3a0);
        pcVar20 = "";
        if (local_388.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar20 = ((local_388.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_398,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                   ,0xc3,pcVar20);
        testing::internal::AssertHelper::operator=(&local_398,&local_3a0);
        testing::internal::AssertHelper::~AssertHelper(&local_398);
        if (CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != 0) {
          bVar18 = testing::internal::IsTrue(true);
          if ((bVar18) &&
             ((long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) != (long *)0x0)
             ) {
            (**(code **)(*(long *)CONCAT44(local_3a0.ss_.ptr_._4_4_,(index_t)local_3a0.ss_.ptr_) + 8
                        ))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_380);
  }
  RemoveFile(local_240.model_file._M_dataplus._M_p);
  Model::~Model(&local_360);
  Model::~Model(&local_2d0);
  HyperParam::~HyperParam(&local_240);
  return;
}

Assistant:

TEST(MODEL_TEST, Save_and_Load) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 
                    hyper_param.auxiliary_size);
  real_t* w = model_ffm.GetParameter_w();
  index_t w_len = model_ffm.GetNumParameter_w();
  for (int i = 0; i < w_len; ++i) {
    w[i] = 2.5;
  }
  real_t* v = model_ffm.GetParameter_v();
  index_t v_len = model_ffm.GetNumParameter_v();
  for (int i = 0; i < v_len; ++i) {
    v[i] = 3.5;
  }
  model_ffm.Serialize(hyper_param.model_file);
  Model new_model(hyper_param.model_file);
  real_t* b = new_model.GetParameter_b();
  w = new_model.GetParameter_w();
  w_len = new_model.GetNumParameter_w();
  v = new_model.GetParameter_v();
  v_len = new_model.GetNumParameter_v();
  index_t param_num_w = hyper_param.num_feature * 2;
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(w_len, param_num_w);
  EXPECT_EQ(v_len, param_num_v);
  EXPECT_EQ(param_num_v+param_num_w+2, new_model.GetNumParameter());
  EXPECT_EQ(hyper_param.score_func, new_model.GetScoreFunction());
  EXPECT_EQ(hyper_param.loss_func, new_model.GetLossFunction());
  EXPECT_EQ(hyper_param.num_K, new_model.GetNumK());
  EXPECT_EQ(hyper_param.num_feature, new_model.GetNumFeature());
  EXPECT_EQ(hyper_param.num_field, new_model.GetNumField());
  EXPECT_EQ(hyper_param.auxiliary_size, new_model.GetAuxiliarySize());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  for (int i = 0; i < w_len; ++i) {
    EXPECT_FLOAT_EQ(w[i], 2.5);
  }
  for (int i = 0; i < v_len; ++i) {
    EXPECT_FLOAT_EQ(v[i], 3.5);
  }
  RemoveFile(hyper_param.model_file.c_str());
}